

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

uint16_t __thiscall r_exec::IPGMContext::getChildrenCount(IPGMContext *this)

{
  Data DVar1;
  byte bVar2;
  uint64_t uVar3;
  size_type sVar4;
  uint16_t c;
  IPGMContext *this_local;
  
  DVar1 = (this->super__Context).data;
  if (DVar1 == MKS) {
    (*(this->object->super__Object)._vptr__Object[0x13])();
    uVar3 = r_code::list<r_code::Code_*>::size(&this->object->markers);
    this_local._6_2_ = (ushort)uVar3;
    (*(this->object->super__Object)._vptr__Object[0x14])();
  }
  else if (DVar1 == VWS) {
    (*(this->object->super__Object)._vptr__Object[0x11])();
    sVar4 = std::
            unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
            ::size(&this->object->views);
    this_local._6_2_ = (ushort)sVar4;
    (*(this->object->super__Object)._vptr__Object[0x12])();
  }
  else {
    bVar2 = r_code::Atom::getAtomCount();
    this_local._6_2_ = (ushort)bVar2;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t getChildrenCount() const
    {
        uint16_t c;

        switch (data) {
        case MKS:
            object->acq_markers();
            c = object->markers.size();
            object->rel_markers();
            return c;

        case VWS:
            object->acq_views();
            c = object->views.size();
            object->rel_views();
            return c;

        default:
            return code[index].getAtomCount();
        }
    }